

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.h
# Opt level: O0

void __thiscall bloaty::ObjectFile::set_debug_file(ObjectFile *this,ObjectFile *file)

{
  __type _Var1;
  long in_RSI;
  long *in_RDI;
  string local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string local_30 [32];
  long local_10;
  
  local_10 = in_RSI;
  (**(code **)(*(long *)in_RDI[2] + 0x10))(local_30);
  (**(code **)(*in_RDI + 0x10))(local_50);
  _Var1 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (!_Var1) {
    __assert_fail("debug_file_->GetBuildId() == GetBuildId()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.h",
                  0x11a,"void bloaty::ObjectFile::set_debug_file(const ObjectFile *)");
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  in_RDI[2] = local_10;
  return;
}

Assistant:

void set_debug_file(const ObjectFile* file) {
    assert(debug_file_->GetBuildId() == GetBuildId());
    debug_file_ = file;
  }